

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

void Kf_ObjSetCuts(Kf_Man_t *p,int i,Vec_Int_t *vVec)

{
  int *piVar1;
  int iVar2;
  int *__src;
  int iVar3;
  word **ppwVar4;
  word *pwVar5;
  int iVar6;
  word wVar7;
  int iVar8;
  size_t __size;
  
  iVar2 = vVec->nSize;
  iVar8 = iVar2 + 1 >> 1;
  iVar3 = 1 << ((byte)(p->pMem).nPageSize & 0x1f);
  if (iVar3 <= iVar8) {
    __assert_fail("nWords < (1 << p->nPageSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecSet.h"
                  ,0xd8,"int Vec_SetAppend(Vec_Set_t *, int *, int)");
  }
  __src = vVec->pArray;
  piVar1 = &(p->pMem).nEntries;
  *piVar1 = *piVar1 + 1;
  ppwVar4 = (p->pMem).pPages;
  iVar6 = (p->pMem).iPage;
  if (iVar3 <= (int)*ppwVar4[iVar6] + iVar8) {
    iVar6 = iVar6 + 1;
    (p->pMem).iPage = iVar6;
    iVar3 = (p->pMem).nPagesAlloc;
    if (iVar6 == iVar3) {
      __size = (long)iVar3 << 4;
      if (ppwVar4 == (word **)0x0) {
        ppwVar4 = (word **)malloc(__size);
      }
      else {
        ppwVar4 = (word **)realloc(ppwVar4,__size);
      }
      (p->pMem).pPages = ppwVar4;
      iVar3 = (p->pMem).nPagesAlloc;
      memset(ppwVar4 + iVar3,0,(long)iVar3 << 3);
      (p->pMem).nPagesAlloc = iVar3 * 2;
    }
    ppwVar4 = (p->pMem).pPages;
    iVar3 = (p->pMem).iPage;
    if (ppwVar4[iVar3] == (word *)0x0) {
      pwVar5 = (word *)malloc((0x100000000 << ((byte)(p->pMem).nPageSize & 0x3f)) >> 0x1d);
      ppwVar4[iVar3] = pwVar5;
    }
    pwVar5 = (p->pMem).pPages[iVar3];
    *pwVar5 = 2;
    pwVar5[1] = 0xffffffffffffffff;
  }
  if (__src != (int *)0x0) {
    pwVar5 = (p->pMem).pPages[(p->pMem).iPage];
    memcpy(pwVar5 + (int)*pwVar5,__src,(long)iVar2 << 2);
  }
  iVar2 = (p->pMem).iPage;
  pwVar5 = (p->pMem).pPages[iVar2];
  wVar7 = (long)iVar8 + *pwVar5;
  *pwVar5 = wVar7;
  if ((-1 < i) && (i < (p->vCuts).nSize)) {
    (p->vCuts).pArray[(uint)i] =
         (iVar2 << ((byte)(p->pMem).nPageSize & 0x1f)) + ((int)wVar7 - iVar8);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

static inline void  Kf_ObjSetCuts( Kf_Man_t * p, int i, Vec_Int_t * vVec ) { Vec_IntWriteEntry(&p->vCuts, i, Vec_SetAppend(&p->pMem, Vec_IntArray(vVec), Vec_IntSize(vVec)));  }